

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O2

int vorbis_decode_packet(vorb *f,int *len,int *p_left,int *p_right)

{
  Floor *pFVar1;
  float fVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  ushort uVar7;
  ushort uVar8;
  int iVar9;
  int32 n;
  Floor *pFVar10;
  int16 *piVar11;
  MappingChannel *pMVar12;
  float *pfVar13;
  short *psVar14;
  int *piVar15;
  int iVar16;
  uint n_00;
  uint32 uVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  short sVar26;
  uint uVar27;
  ulong uVar28;
  long lVar29;
  int iVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  int iVar34;
  int iVar35;
  float *pfVar36;
  int iVar37;
  Codebook *pCVar38;
  Mapping *pMVar39;
  long lVar40;
  bool bVar41;
  float fVar42;
  float fVar43;
  int n2;
  int right_end;
  int mode;
  int *local_9d8;
  int *local_9d0;
  Mode *local_9c8;
  int left_end;
  float *residue_buffers [16];
  uint8 local_938 [256];
  int really_zero_channel [256];
  int zero_channel [256];
  
  local_9d8 = len;
  iVar16 = vorbis_decode_initial(f,p_left,&left_end,p_right,&right_end,&mode);
  if (iVar16 == 0) {
    return 0;
  }
  local_9c8 = f->mode_config + mode;
  iVar16 = *p_left;
  iVar21 = *p_right;
  pMVar39 = f->mapping + f->mode_config[mode].mapping;
  iVar9 = f->blocksize[local_9c8->blockflag];
  n_00 = iVar9 >> 1;
  local_9d0 = p_left;
  for (lVar29 = 0; lVar29 < f->channels; lVar29 = lVar29 + 1) {
    bVar3 = pMVar39->chan[lVar29].mux;
    zero_channel[lVar29] = 0;
    uVar23 = (ulong)pMVar39->submap_floor[bVar3];
    if (f->floor_types[uVar23] == 0) {
      f->error = VORBIS_invalid_stream;
      return 0;
    }
    pFVar10 = f->floor_config;
    uVar17 = get_bits(f,1);
    if (uVar17 == 0) {
LAB_0011b439:
      zero_channel[lVar29] = 1;
    }
    else {
      pFVar1 = pFVar10 + uVar23;
      n = *(int32 *)("" + (ulong)(pFVar1->floor1).floor1_multiplier * 4 + 0xc);
      piVar11 = f->finalY[lVar29];
      iVar18 = ilog(n);
      uVar17 = get_bits(f,iVar18 + -1);
      *piVar11 = (int16)uVar17;
      uVar17 = get_bits(f,iVar18 + -1);
      piVar11[1] = (int16)uVar17;
      iVar18 = 2;
      for (uVar28 = 0; uVar28 < (pFVar1->floor0).order; uVar28 = uVar28 + 1) {
        bVar3 = *(byte *)((long)pFVar1 + uVar28 + 1);
        uVar24 = (ulong)bVar3;
        bVar4 = *(byte *)((long)pFVar1 + uVar24 + 0x21);
        bVar5 = *(byte *)((long)pFVar1 + uVar24 + 0x31);
        if (bVar5 == 0) {
          uVar33 = 0;
        }
        else {
          pCVar38 = f->codebooks + *(byte *)((long)pFVar1 + uVar24 + 0x41);
          if (f->valid_bits < 10) {
            prep_huffman(f);
          }
          uVar33 = (uint)pCVar38->fast_huffman[f->acc & 0x3ff];
          if (pCVar38->fast_huffman[f->acc & 0x3ff] < 0) {
            uVar33 = codebook_decode_scalar_raw(f,pCVar38);
          }
          else {
            bVar6 = pCVar38->codeword_lengths[(int)uVar33];
            f->acc = f->acc >> (bVar6 & 0x1f);
            iVar19 = f->valid_bits - (uint)bVar6;
            bVar41 = iVar19 < 0;
            if (iVar19 < 1) {
              iVar19 = 0;
            }
            if (bVar41) {
              uVar33 = 0xffffffff;
            }
            f->valid_bits = iVar19;
          }
          if (pCVar38->sparse != '\0') {
            uVar33 = pCVar38->sorted_values[(int)uVar33];
          }
        }
        iVar19 = (uint)bVar4 + iVar18;
        for (lVar40 = (long)iVar18; iVar19 != lVar40; lVar40 = lVar40 + 1) {
          lVar22 = (long)*(short *)((long)pFVar1 +
                                   (ulong)(uVar33 & ~(-1 << (bVar5 & 0x1f))) * 2 +
                                   (ulong)bVar3 * 0x10 + 0x52);
          uVar33 = (int)uVar33 >> (bVar5 & 0x1f);
          if (lVar22 < 0) {
            iVar18 = 0;
          }
          else {
            pCVar38 = f->codebooks + lVar22;
            if (f->valid_bits < 10) {
              prep_huffman(f);
            }
            iVar18 = (int)pCVar38->fast_huffman[f->acc & 0x3ff];
            if (pCVar38->fast_huffman[f->acc & 0x3ff] < 0) {
              iVar18 = codebook_decode_scalar_raw(f,pCVar38);
            }
            else {
              bVar4 = pCVar38->codeword_lengths[iVar18];
              f->acc = f->acc >> (bVar4 & 0x1f);
              iVar30 = f->valid_bits - (uint)bVar4;
              iVar35 = iVar30;
              if (iVar30 < 1) {
                iVar35 = 0;
              }
              if (iVar30 < 0) {
                iVar18 = -1;
              }
              f->valid_bits = iVar35;
            }
            if (pCVar38->sparse != '\0') {
              iVar18 = pCVar38->sorted_values[iVar18];
            }
          }
          piVar11[lVar40] = (int16)iVar18;
        }
        iVar18 = iVar19;
      }
      if (f->valid_bits == -1) goto LAB_0011b439;
      really_zero_channel[0]._0_2_ = 0x101;
      for (lVar40 = 0; uVar33 = (pFVar1->floor1).values, lVar40 + 2 < (long)(int)uVar33;
          lVar40 = lVar40 + 1) {
        bVar3 = *(byte *)((long)pFVar10 + lVar40 * 2 + uVar23 * 0x63c + 0x444);
        bVar4 = *(byte *)((long)pFVar10 + lVar40 * 2 + uVar23 * 0x63c + 0x445);
        uVar7 = *(ushort *)((long)pFVar10 + lVar40 * 2 + uVar23 * 0x63c + 0x156);
        uVar8 = *(ushort *)((long)pFVar1 + (ulong)((uint)bVar4 + (uint)bVar4) + 0x152);
        iVar30 = (int)*(short *)((long)piVar11 + (ulong)((uint)bVar3 + (uint)bVar3));
        iVar35 = (int)*(short *)((long)piVar11 + (ulong)((uint)bVar4 + (uint)bVar4));
        uVar33 = (uint)*(ushort *)((long)pFVar1 + (ulong)((uint)bVar3 + (uint)bVar3) + 0x152);
        iVar18 = SDL_abs(iVar35 - iVar30);
        iVar19 = (int)(iVar18 * (uVar7 - uVar33)) / (int)(uVar8 - uVar33);
        iVar18 = -iVar19;
        if (-1 < iVar35 - iVar30) {
          iVar18 = iVar19;
        }
        iVar18 = iVar18 + iVar30;
        sVar26 = piVar11[lVar40 + 2];
        uVar33 = (uint)sVar26;
        if (sVar26 == 0) {
          *(undefined1 *)((long)really_zero_channel + lVar40 + 2) = 0;
LAB_0011b3e1:
          sVar26 = (short)iVar18;
LAB_0011b3f0:
          piVar11[lVar40 + 2] = sVar26;
        }
        else {
          iVar35 = n - iVar18;
          iVar19 = iVar18;
          if (iVar35 < iVar18) {
            iVar19 = iVar35;
          }
          *(undefined1 *)((long)really_zero_channel + (ulong)bVar4) = 1;
          *(undefined1 *)((long)really_zero_channel + (ulong)bVar3) = 1;
          *(undefined1 *)((long)really_zero_channel + lVar40 + 2) = 1;
          if ((int)uVar33 < iVar19 * 2) {
            if ((uVar33 & 1) == 0) {
              iVar18 = iVar18 + (uVar33 >> 1);
            }
            else {
              iVar18 = iVar18 - (uVar33 + 1 >> 1);
            }
            goto LAB_0011b3e1;
          }
          if (iVar35 <= iVar18) {
            sVar26 = ((short)iVar18 - sVar26) + (short)iVar35 + -1;
            goto LAB_0011b3f0;
          }
        }
      }
      uVar23 = (ulong)uVar33;
      if ((int)uVar33 < 1) {
        uVar23 = 0;
      }
      for (uVar28 = 0; uVar23 != uVar28; uVar28 = uVar28 + 1) {
        if (*(char *)((long)really_zero_channel + uVar28) == '\0') {
          piVar11[uVar28] = -1;
        }
      }
    }
  }
  SDL_memcpy(really_zero_channel,zero_channel,(long)f->channels << 2);
  uVar7 = pMVar39->coupling_steps;
  for (lVar29 = 0; (ulong)uVar7 * 3 != lVar29; lVar29 = lVar29 + 3) {
    pMVar12 = pMVar39->chan;
    bVar3 = (&pMVar12->magnitude)[lVar29];
    if (zero_channel[bVar3] == 0) {
      uVar23 = (ulong)(&pMVar12->angle)[lVar29];
LAB_0011b4a1:
      zero_channel[uVar23] = 0;
      zero_channel[bVar3] = 0;
    }
    else {
      uVar23 = (ulong)(&pMVar12->angle)[lVar29];
      if (zero_channel[uVar23] == 0) goto LAB_0011b4a1;
    }
  }
  for (uVar23 = 0; uVar23 < pMVar39->submaps; uVar23 = uVar23 + 1) {
    uVar24 = 0;
    uVar28 = (ulong)(uint)f->channels;
    if (f->channels < 1) {
      uVar28 = uVar24;
    }
    lVar29 = 0x1bc;
    iVar18 = 0;
    for (; uVar28 * 3 != uVar24; uVar24 = uVar24 + 3) {
      if (uVar23 == (&pMVar39->chan->mux)[uVar24]) {
        bVar41 = *(int *)((long)really_zero_channel + lVar29 + 0x244) == 0;
        if (bVar41) {
          pfVar36 = *(float **)((long)&f->sample_rate + lVar29 * 2);
        }
        else {
          pfVar36 = (float *)0x0;
        }
        local_938[iVar18] = !bVar41;
        residue_buffers[iVar18] = pfVar36;
        iVar18 = iVar18 + 1;
      }
      lVar29 = lVar29 + 4;
    }
    decode_residue(f,residue_buffers,iVar18,n_00,(uint)pMVar39->submap_residue[uVar23],local_938);
  }
  uVar23 = (ulong)pMVar39->coupling_steps;
  uVar28 = 0;
  if (0 < (int)n_00) {
    uVar28 = (ulong)n_00;
  }
  while (0 < (long)uVar23) {
    uVar23 = uVar23 - 1;
    pfVar36 = f->channel_buffers[pMVar39->chan[uVar23].magnitude];
    pfVar13 = f->channel_buffers[pMVar39->chan[uVar23].angle];
    for (uVar24 = 0; uVar28 != uVar24; uVar24 = uVar24 + 1) {
      fVar43 = pfVar36[uVar24];
      fVar2 = pfVar13[uVar24];
      fVar42 = fVar43;
      if (fVar43 <= 0.0) {
        if (fVar2 <= 0.0) {
          fVar42 = fVar43 - fVar2;
        }
        else {
          fVar43 = fVar2 + fVar43;
        }
      }
      else if (fVar2 <= 0.0) {
        fVar42 = fVar2 + fVar43;
      }
      else {
        fVar43 = fVar43 - fVar2;
      }
      pfVar36[uVar24] = fVar42;
      pfVar13[uVar24] = fVar43;
    }
  }
  for (lVar29 = 0; piVar15 = local_9d0, uVar23 = (ulong)f->channels, lVar29 < (long)uVar23;
      lVar29 = lVar29 + 1) {
    pfVar36 = f->channel_buffers[lVar29];
    if (really_zero_channel[lVar29] == 0) {
      uVar23 = (ulong)pMVar39->submap_floor[pMVar39->chan[lVar29].mux];
      if (f->floor_types[uVar23] == 0) {
        f->error = VORBIS_invalid_stream;
      }
      else {
        psVar14 = f->finalY[lVar29];
        pFVar10 = f->floor_config;
        lVar22 = uVar23 * 0x63c;
        uVar33 = (uint)*(byte *)((long)pFVar10 + lVar22 + 0x634) * (int)*psVar14;
        uVar28 = 0;
        for (lVar40 = 1; iVar18 = (int)uVar28, lVar40 < (&pFVar10->floor1)[uVar23].values;
            lVar40 = lVar40 + 1) {
          uVar25 = (ulong)*(byte *)((long)pFVar10 + lVar40 + lVar22 + 0x346);
          iVar19 = (int)psVar14[uVar25];
          uVar24 = uVar28;
          uVar32 = uVar33;
          if (-1 < iVar19) {
            uVar32 = (uint)(&pFVar10->floor1)[uVar23].floor1_multiplier * iVar19;
            uVar20 = (uint)*(ushort *)((long)pFVar10 + uVar25 * 2 + lVar22 + 0x152);
            iVar19 = uVar20 - iVar18;
            if (iVar19 != 0) {
              iVar37 = uVar32 - uVar33;
              iVar35 = SDL_abs(iVar37);
              iVar30 = SDL_abs((long)iVar37 / (long)iVar19 & 0xffffffff);
              uVar27 = n_00;
              if ((int)uVar20 < (int)n_00) {
                uVar27 = uVar20;
              }
              uVar24 = (ulong)uVar20;
              if (iVar18 < (int)uVar27) {
                pfVar36[uVar28] = inverse_db_table[uVar33 & 0xff] * pfVar36[uVar28];
                iVar18 = 0;
                while (uVar28 = uVar28 + 1, (long)uVar28 < (long)(int)uVar27) {
                  iVar18 = iVar18 + (iVar35 - iVar30 * iVar19);
                  uVar31 = 0;
                  iVar34 = 0;
                  if (iVar19 <= iVar18) {
                    uVar31 = iVar37 >> 0x1f | 1;
                    iVar34 = iVar19;
                  }
                  iVar18 = iVar18 - iVar34;
                  uVar33 = uVar33 + (int)((long)iVar37 / (long)iVar19) + uVar31;
                  pfVar36[uVar28] = inverse_db_table[uVar33 & 0xff] * pfVar36[uVar28];
                }
                uVar24 = (ulong)uVar20;
              }
            }
          }
          uVar33 = uVar32;
          uVar28 = uVar24;
        }
        if (iVar18 < (int)n_00) {
          for (; (long)(int)n_00 != uVar28; uVar28 = uVar28 + 1) {
            pfVar36[uVar28] = inverse_db_table[(int)uVar33] * pfVar36[uVar28];
          }
        }
      }
    }
    else {
      SDL_memset(pfVar36,0,(long)(int)n_00 * 4);
    }
  }
  for (lVar29 = 0; lVar29 < (int)uVar23; lVar29 = lVar29 + 1) {
    inverse_mdct(f->channel_buffers[lVar29],iVar9,f,(uint)local_9c8->blockflag);
    uVar23 = (ulong)(uint)f->channels;
  }
  flush_packet(f);
  if (f->first_decode == '\0') {
    iVar9 = f->discard_samples_deferred;
    if (iVar9 != 0) {
      if (iVar9 < iVar21 - iVar16) {
        *piVar15 = iVar16 + iVar9;
        f->discard_samples_deferred = 0;
        iVar16 = iVar16 + iVar9;
      }
      else {
        f->discard_samples_deferred = iVar9 - (iVar21 - iVar16);
        *piVar15 = iVar21;
        iVar16 = iVar21;
      }
    }
  }
  else {
    f->current_loc = -n_00;
    f->discard_samples_deferred = iVar9 - right_end;
    f->current_loc_valid = 1;
    f->first_decode = '\0';
  }
  if (f->last_seg_which == f->end_seg_with_known_loc) {
    if ((f->current_loc_valid != 0) && ((f->page_flag & 4) != 0)) {
      uVar33 = f->current_loc;
      uVar32 = f->known_loc_for_packet;
      if (uVar32 < (right_end - iVar16) + uVar33) {
        iVar21 = uVar32 - uVar33;
        if (uVar32 < uVar33) {
          iVar21 = 0;
        }
        iVar9 = iVar21 + iVar16;
        if (right_end <= iVar21 + iVar16) {
          iVar9 = right_end;
        }
        *local_9d8 = iVar9;
        f->current_loc = f->current_loc + iVar9;
        return 1;
      }
    }
    uVar17 = (iVar16 - n_00) + f->known_loc_for_packet;
    f->current_loc_valid = 1;
  }
  else {
    if (f->current_loc_valid == 0) goto LAB_0011b9d4;
    uVar17 = f->current_loc;
  }
  f->current_loc = (iVar21 - iVar16) + uVar17;
LAB_0011b9d4:
  *local_9d8 = right_end;
  return 1;
}

Assistant:

static int vorbis_decode_packet(vorb *f, int *len, int *p_left, int *p_right)
{
   int mode, left_end, right_end;
   if (!vorbis_decode_initial(f, p_left, &left_end, p_right, &right_end, &mode)) return 0;
   return vorbis_decode_packet_rest(f, len, f->mode_config + mode, *p_left, left_end, *p_right, right_end, p_left);
}